

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::dumpTokens(yaml *this,StringRef Input,raw_ostream *OS)

{
  StringRef Str;
  StringRef Input_00;
  raw_ostream *this_00;
  raw_ostream *this_01;
  int local_23c;
  undefined1 local_220 [8];
  Token T;
  undefined1 local_1c8 [8];
  Scanner scanner;
  SourceMgr SM;
  raw_ostream *OS_local;
  StringRef Input_local;
  
  this_01 = (raw_ostream *)Input.Length;
  SourceMgr::SourceMgr((SourceMgr *)&scanner.EC);
  Input_00.Length = (size_t)Input.Data;
  Input_00.Data = (char *)this;
  Scanner::Scanner((Scanner *)local_1c8,Input_00,(SourceMgr *)&scanner.EC,true,(error_code *)0x0);
  do {
    Scanner::getNext((Token *)local_220,(Scanner *)local_1c8);
    switch(local_220._0_4_) {
    case 0:
      break;
    case 1:
      raw_ostream::operator<<(this_01,"Stream-Start: ");
      break;
    case 2:
      raw_ostream::operator<<(this_01,"Stream-End: ");
      break;
    case 3:
      raw_ostream::operator<<(this_01,"Version-Directive: ");
      break;
    case 4:
      raw_ostream::operator<<(this_01,"Tag-Directive: ");
      break;
    case 5:
      raw_ostream::operator<<(this_01,"Document-Start: ");
      break;
    case 6:
      raw_ostream::operator<<(this_01,"Document-End: ");
      break;
    case 7:
      raw_ostream::operator<<(this_01,"Block-Entry: ");
      break;
    case 8:
      raw_ostream::operator<<(this_01,"Block-End: ");
      break;
    case 9:
      raw_ostream::operator<<(this_01,"Block-Sequence-Start: ");
      break;
    case 10:
      raw_ostream::operator<<(this_01,"Block-Mapping-Start: ");
      break;
    case 0xb:
      raw_ostream::operator<<(this_01,"Flow-Entry: ");
      break;
    case 0xc:
      raw_ostream::operator<<(this_01,"Flow-Sequence-Start: ");
      break;
    case 0xd:
      raw_ostream::operator<<(this_01,"Flow-Sequence-End: ");
      break;
    case 0xe:
      raw_ostream::operator<<(this_01,"Flow-Mapping-Start: ");
      break;
    case 0xf:
      raw_ostream::operator<<(this_01,"Flow-Mapping-End: ");
      break;
    case 0x10:
      raw_ostream::operator<<(this_01,"Key: ");
      break;
    case 0x11:
      raw_ostream::operator<<(this_01,"Value: ");
      break;
    case 0x12:
      raw_ostream::operator<<(this_01,"Scalar: ");
      break;
    case 0x13:
      raw_ostream::operator<<(this_01,"Block Scalar: ");
      break;
    case 0x14:
      raw_ostream::operator<<(this_01,"Alias: ");
      break;
    case 0x15:
      raw_ostream::operator<<(this_01,"Anchor: ");
      break;
    case 0x16:
      raw_ostream::operator<<(this_01,"Tag: ");
    }
    Str.Length = (size_t)T.Range.Data;
    Str.Data = (char *)T._0_8_;
    this_00 = raw_ostream::operator<<(this_01,Str);
    raw_ostream::operator<<(this_00,"\n");
    if (local_220._0_4_ == TK_StreamEnd) {
      local_23c = 3;
    }
    else if (local_220._0_4_ == TK_Error) {
      Input_local.Length._7_1_ = 0;
      local_23c = 1;
    }
    else {
      local_23c = 0;
    }
    Token::~Token((Token *)local_220);
  } while (local_23c == 0);
  if (local_23c == 3) {
    Input_local.Length._7_1_ = 1;
  }
  Scanner::~Scanner((Scanner *)local_1c8);
  SourceMgr::~SourceMgr((SourceMgr *)&scanner.EC);
  return (bool)(Input_local.Length._7_1_ & 1);
}

Assistant:

bool yaml::dumpTokens(StringRef Input, raw_ostream &OS) {
  SourceMgr SM;
  Scanner scanner(Input, SM);
  while (true) {
    Token T = scanner.getNext();
    switch (T.Kind) {
    case Token::TK_StreamStart:
      OS << "Stream-Start: ";
      break;
    case Token::TK_StreamEnd:
      OS << "Stream-End: ";
      break;
    case Token::TK_VersionDirective:
      OS << "Version-Directive: ";
      break;
    case Token::TK_TagDirective:
      OS << "Tag-Directive: ";
      break;
    case Token::TK_DocumentStart:
      OS << "Document-Start: ";
      break;
    case Token::TK_DocumentEnd:
      OS << "Document-End: ";
      break;
    case Token::TK_BlockEntry:
      OS << "Block-Entry: ";
      break;
    case Token::TK_BlockEnd:
      OS << "Block-End: ";
      break;
    case Token::TK_BlockSequenceStart:
      OS << "Block-Sequence-Start: ";
      break;
    case Token::TK_BlockMappingStart:
      OS << "Block-Mapping-Start: ";
      break;
    case Token::TK_FlowEntry:
      OS << "Flow-Entry: ";
      break;
    case Token::TK_FlowSequenceStart:
      OS << "Flow-Sequence-Start: ";
      break;
    case Token::TK_FlowSequenceEnd:
      OS << "Flow-Sequence-End: ";
      break;
    case Token::TK_FlowMappingStart:
      OS << "Flow-Mapping-Start: ";
      break;
    case Token::TK_FlowMappingEnd:
      OS << "Flow-Mapping-End: ";
      break;
    case Token::TK_Key:
      OS << "Key: ";
      break;
    case Token::TK_Value:
      OS << "Value: ";
      break;
    case Token::TK_Scalar:
      OS << "Scalar: ";
      break;
    case Token::TK_BlockScalar:
      OS << "Block Scalar: ";
      break;
    case Token::TK_Alias:
      OS << "Alias: ";
      break;
    case Token::TK_Anchor:
      OS << "Anchor: ";
      break;
    case Token::TK_Tag:
      OS << "Tag: ";
      break;
    case Token::TK_Error:
      break;
    }
    OS << T.Range << "\n";
    if (T.Kind == Token::TK_StreamEnd)
      break;
    else if (T.Kind == Token::TK_Error)
      return false;
  }
  return true;
}